

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void aom_dc_predictor_16x8_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  int iVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined4 uVar4;
  undefined1 uVar6;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)left;
  auVar5 = psadbw(auVar5,(undefined1  [16])0x0);
  auVar7 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])above);
  iVar1 = (CONCAT22(auVar7._2_2_ + auVar5._2_2_ + auVar7._10_2_,
                    auVar7._0_2_ + auVar5._0_2_ + auVar7._8_2_) + 0xcU >> 3) * 0x5556;
  uVar6 = (undefined1)((uint)iVar1 >> 0x18);
  uVar3 = (undefined1)((uint)iVar1 >> 0x10);
  auVar5 = ZEXT416(CONCAT22(CONCAT11(uVar6,uVar6),CONCAT11(uVar3,uVar3)));
  auVar5 = pshuflw(auVar5,auVar5,0);
  uVar4 = auVar5._0_4_;
  iVar1 = 8;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    *(undefined4 *)dst = uVar4;
    *(undefined4 *)(dst + 4) = uVar4;
    *(undefined4 *)(dst + 8) = uVar4;
    *(undefined4 *)(dst + 0xc) = uVar4;
    dst = dst + stride;
  }
  return;
}

Assistant:

void aom_dc_predictor_16x8_sse2(uint8_t *dst, ptrdiff_t stride,
                                const uint8_t *above, const uint8_t *left) {
  const __m128i sum_left = dc_sum_8(left);
  __m128i sum_above = dc_sum_16_sse2(above);
  sum_above = _mm_add_epi16(sum_above, sum_left);

  uint32_t sum = (uint32_t)_mm_cvtsi128_si32(sum_above);
  sum += 12;
  sum = divide_using_multiply_shift(sum, 3, DC_MULTIPLIER_1X2);
  const __m128i row = _mm_set1_epi8((int8_t)sum);
  dc_store_16xh(&row, 8, dst, stride);
}